

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper_posix.cpp
# Opt level: O0

void __thiscall
pstore::memory_mapper::memory_mapper
          (memory_mapper *this,file_handle *file,bool write_enabled,uint64_t offset,uint64_t length)

{
  __off_t in_R9;
  shared_ptr<void> local_40;
  uint64_t local_30;
  uint64_t length_local;
  uint64_t offset_local;
  file_handle *pfStack_18;
  bool write_enabled_local;
  file_handle *file_local;
  memory_mapper *this_local;
  
  local_30 = length;
  length_local = offset;
  offset_local._7_1_ = write_enabled;
  pfStack_18 = file;
  file_local = (file_handle *)this;
  mmap(&local_40,(size_t)file,write_enabled & 1,(int)offset,(int)length,in_R9);
  memory_mapper_base::memory_mapper_base
            (&this->super_memory_mapper_base,&local_40,(bool)(offset_local._7_1_ & 1),length_local,
             local_30);
  std::shared_ptr<void>::~shared_ptr(&local_40);
  (this->super_memory_mapper_base)._vptr_memory_mapper_base =
       (_func_int **)&PTR__memory_mapper_00182c98;
  return;
}

Assistant:

memory_mapper::memory_mapper (file::file_handle & file, bool const write_enabled,
                                  std::uint64_t const offset, std::uint64_t const length)
            : memory_mapper_base (mmap (file, write_enabled, offset, length), write_enabled, offset,
                                  length) {}